

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

char * icu_63::PropNameData::getName(char *nameGroup,int32_t nameIndex)

{
  int local_1c;
  int32_t numNames;
  int32_t nameIndex_local;
  char *nameGroup_local;
  
  _numNames = nameGroup + 1;
  if ((nameIndex < 0) || (local_1c = nameIndex, *nameGroup <= nameIndex)) {
    nameGroup_local = (char *)0x0;
  }
  else {
    for (; 0 < local_1c; local_1c = local_1c + -1) {
      _numNames = strchr(_numNames,0);
      _numNames = _numNames + 1;
    }
    if (*_numNames == '\0') {
      nameGroup_local = (char *)0x0;
    }
    else {
      nameGroup_local = _numNames;
    }
  }
  return nameGroup_local;
}

Assistant:

const char *PropNameData::getName(const char *nameGroup, int32_t nameIndex) {
    int32_t numNames=*nameGroup++;
    if(nameIndex<0 || numNames<=nameIndex) {
        return NULL;
    }
    // Skip nameIndex names.
    for(; nameIndex>0; --nameIndex) {
        nameGroup=uprv_strchr(nameGroup, 0)+1;
    }
    if(*nameGroup==0) {
        return NULL;  // no name (Property[Value]Aliases.txt has "n/a")
    }
    return nameGroup;
}